

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGLayoutState::SVGLayoutState
          (SVGLayoutState *this,SVGLayoutState *parent,SVGElement *element)

{
  pointer pcVar1;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_node_base *p_Var3;
  string_view *psVar4;
  pointer pLVar5;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  void *pvVar6;
  FillRule FVar7;
  bool bVar8;
  FillRule FVar9;
  Overflow OVar10;
  Visibility VVar11;
  LineJoin LVar12;
  MaskType MVar13;
  Display DVar14;
  DominantBaseline DVar15;
  AlignmentBaseline AVar16;
  FontWeight FVar17;
  Direction DVar18;
  WhiteSpace WVar19;
  FontStyle FVar20;
  LineCap LVar21;
  TextAnchor TVar22;
  int iVar23;
  Color CVar24;
  lunasvg *plVar25;
  undefined8 uVar26;
  _Fwd_list_node_base *p_Var27;
  ulong uVar28;
  long lVar29;
  Type TVar30;
  lunasvg *plVar31;
  LengthUnits LVar32;
  undefined1 *puVar33;
  string *this_00;
  pointer pLVar34;
  lunasvg *in_R8;
  Color *in_R9;
  string_view *input_04;
  _Fwd_list_node_base *p_Var35;
  float fVar36;
  undefined1 auVar37 [16];
  string_view input_05;
  string_view input_06;
  string_view input_07;
  string_view input_08;
  string_view input_09;
  string_view input_10;
  string_view input_11;
  string_view input_12;
  string_view input_13;
  string_view input_14;
  string_view input_15;
  string_view input_16;
  string_view input_17;
  Paint local_f8;
  string_view local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  LengthList *local_40;
  Length local_38;
  
  this->m_parent = parent;
  this->m_element = element;
  local_48 = (string *)&this->m_fill;
  local_88 = &(this->m_fill).m_id.field_2;
  (this->m_fill).m_id._M_dataplus._M_p = (pointer)local_88;
  pcVar1 = (parent->m_fill).m_id._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_48,pcVar1,pcVar1 + (parent->m_fill).m_id._M_string_length);
  (this->m_fill).m_color.m_value = (parent->m_fill).m_color.m_value;
  local_50 = (string *)&this->m_stroke;
  local_90 = &(this->m_stroke).m_id.field_2;
  (this->m_stroke).m_id._M_dataplus._M_p = (pointer)local_90;
  pcVar1 = (parent->m_stroke).m_id._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_50,pcVar1,pcVar1 + (parent->m_stroke).m_id._M_string_length);
  (this->m_stroke).m_color.m_value = (parent->m_stroke).m_color.m_value;
  (this->m_color).m_value = (parent->m_color).m_value;
  (this->m_stop_color).m_value = 0xff000000;
  this->m_opacity = 1.0;
  fVar36 = parent->m_stroke_opacity;
  this->m_fill_opacity = parent->m_fill_opacity;
  this->m_stroke_opacity = fVar36;
  this->m_stop_opacity = 1.0;
  fVar36 = parent->m_font_size;
  this->m_stroke_miterlimit = parent->m_stroke_miterlimit;
  this->m_font_size = fVar36;
  (this->m_baseline_shit).m_type = Baseline;
  (this->m_baseline_shit).m_length.m_value = 0.0;
  (this->m_baseline_shit).m_length.m_units = None;
  this->m_stroke_width = parent->m_stroke_width;
  this->m_stroke_dashoffset = parent->m_stroke_dashoffset;
  std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
            (&this->m_stroke_dasharray,&parent->m_stroke_dasharray);
  LVar12 = parent->m_stroke_linejoin;
  FVar9 = parent->m_fill_rule;
  FVar7 = parent->m_clip_rule;
  this->m_stroke_linecap = parent->m_stroke_linecap;
  this->m_stroke_linejoin = LVar12;
  this->m_fill_rule = FVar9;
  this->m_clip_rule = FVar7;
  this->m_font_weight = parent->m_font_weight;
  this->m_font_style = parent->m_font_style;
  this->m_alignment_baseline = Auto;
  TVar22 = parent->m_text_anchor;
  WVar19 = parent->m_white_space;
  DVar18 = parent->m_direction;
  this->m_dominant_baseline = parent->m_dominant_baseline;
  this->m_text_anchor = TVar22;
  this->m_white_space = WVar19;
  this->m_direction = DVar18;
  this->m_display = Inline;
  this->m_visibility = parent->m_visibility;
  this->m_overflow = (element->super_SVGNode).m_parentElement != (SVGElement *)0x0;
  this->m_mask_type = Luminance;
  local_58 = (string *)&this->m_mask;
  local_98 = &(this->m_mask).field_2;
  (this->m_mask)._M_dataplus._M_p = (pointer)local_98;
  (this->m_mask)._M_string_length = 0;
  (this->m_mask).field_2._M_local_buf[0] = '\0';
  local_60 = (string *)&this->m_clip_path;
  local_a0 = &(this->m_clip_path).field_2;
  (this->m_clip_path)._M_dataplus._M_p = (pointer)local_a0;
  (this->m_clip_path)._M_string_length = 0;
  (this->m_clip_path).field_2._M_local_buf[0] = '\0';
  local_68 = (string *)&this->m_marker_start;
  local_a8 = &(this->m_marker_start).field_2;
  (this->m_marker_start)._M_dataplus._M_p = (pointer)local_a8;
  pcVar1 = (parent->m_marker_start)._M_dataplus._M_p;
  local_40 = &this->m_stroke_dasharray;
  std::__cxx11::string::_M_construct<char*>
            (local_68,pcVar1,pcVar1 + (parent->m_marker_start)._M_string_length);
  local_70 = (string *)&this->m_marker_mid;
  local_b0 = &(this->m_marker_mid).field_2;
  (this->m_marker_mid)._M_dataplus._M_p = (pointer)local_b0;
  pcVar1 = (parent->m_marker_mid)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_70,pcVar1,pcVar1 + (parent->m_marker_mid)._M_string_length);
  local_78 = (string *)&this->m_marker_end;
  local_b8 = &(this->m_marker_end).field_2;
  (this->m_marker_end)._M_dataplus._M_p = (pointer)local_b8;
  pcVar1 = (parent->m_marker_end)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_78,pcVar1,pcVar1 + (parent->m_marker_end)._M_string_length);
  local_80 = &this->m_font_family;
  local_c0 = &(this->m_font_family).field_2;
  (this->m_font_family)._M_dataplus._M_p = (pointer)local_c0;
  pcVar1 = (parent->m_font_family)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (parent->m_font_family)._M_string_length);
  p_Var2 = (element->m_attributes).
           super__Fwd_list_base<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>._M_impl.
           _M_head._M_next;
joined_r0x0011533d:
  if (p_Var2 == (_Fwd_list_node_base *)0x0) {
    return;
  }
  p_Var3 = p_Var2[3]._M_next;
  if (p_Var3 != (_Fwd_list_node_base *)0x0) {
    psVar4 = (string_view *)p_Var2[2]._M_next;
    p_Var35 = (_Fwd_list_node_base *)0x0;
    p_Var27 = p_Var3;
    input_04 = psVar4;
    do {
      uVar28 = (ulong)(byte)input_04->_M_len;
      if ((0x20 < uVar28) || ((0x100002600U >> (uVar28 & 0x3f) & 1) == 0)) goto LAB_0011538f;
      input_04 = (string_view *)((long)&input_04->_M_len + 1);
      p_Var35 = (_Fwd_list_node_base *)((long)&p_Var35->_M_next + 1);
      p_Var27 = (_Fwd_list_node_base *)((long)&p_Var27[-1]._M_next + 7);
    } while (p_Var27 != (_Fwd_list_node_base *)0x0);
  }
  goto switchD_001153f9_caseD_3;
LAB_0011538f:
  psVar4 = (string_view *)((long)&psVar4[-1]._M_str + 7);
  uVar28 = (ulong)*(byte *)((long)&p_Var3->_M_next + (long)psVar4);
  if ((uVar28 < 0x21) && ((0x100002600U >> (uVar28 & 0x3f) & 1) != 0)) goto code_r0x001153a0;
  plVar25 = (lunasvg *)((long)p_Var3 - (long)p_Var35);
  plVar31 = (lunasvg *)0x7;
  if (plVar25 < (lunasvg *)0x7) {
    plVar31 = plVar25;
  }
  iVar23 = bcmp(input_04,"inherit",(size_t)plVar31);
  if (((_Fwd_list_node_base *)((long)&p_Var3[-1]._M_next + 1) == p_Var35) && (iVar23 == 0))
  goto switchD_001153f9_caseD_3;
  switch(*(undefined1 *)((long)&p_Var2[1]._M_next + 4)) {
  case 1:
    lVar29 = 0x10;
    goto LAB_00115400;
  case 2:
    plVar31 = (lunasvg *)0x8;
    if (plVar25 < (lunasvg *)0x8) {
      plVar31 = plVar25;
    }
    iVar23 = bcmp(input_04,"baseline",(size_t)plVar31);
    if (p_Var3 + -1 == p_Var35) {
      TVar30 = Baseline;
      LVar32 = None;
      fVar36 = 0.0;
      if (iVar23 != 0) goto LAB_001159bf;
    }
    else {
LAB_001159bf:
      plVar31 = (lunasvg *)0x3;
      if (plVar25 < (lunasvg *)0x3) {
        plVar31 = plVar25;
      }
      iVar23 = bcmp(input_04,"sub",(size_t)plVar31);
      if (((_Fwd_list_node_base *)((long)&p_Var3[-1]._M_next + 5) == p_Var35) && (iVar23 == 0)) {
        TVar30 = Sub;
      }
      else {
        plVar31 = (lunasvg *)0x5;
        if (plVar25 < (lunasvg *)0x5) {
          plVar31 = plVar25;
        }
        iVar23 = bcmp(input_04,"super",(size_t)plVar31);
        if (((_Fwd_list_node_base *)((long)&p_Var3[-1]._M_next + 3) != p_Var35) || (iVar23 != 0)) {
          local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
          local_f8.m_id._M_dataplus._M_p._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_ & 0xffffff00;
          input_15._M_str = (char *)input_04;
          input_15._M_len = (size_t)plVar25;
          bVar8 = Length::parse((Length *)&local_f8,input_15,Allow);
          if (!bVar8) {
            local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
            local_f8.m_id._M_dataplus._M_p._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_ & 0xffffff00
            ;
          }
          LVar32 = (LengthUnits)local_f8.m_id._M_dataplus._M_p._4_4_;
          TVar30 = Length;
          fVar36 = local_f8.m_id._M_dataplus._M_p._0_4_;
          goto LAB_00115f43;
        }
        TVar30 = Super;
      }
      LVar32 = None;
      fVar36 = 0.0;
    }
LAB_00115f43:
    (this->m_baseline_shit).m_type = TVar30;
    (this->m_baseline_shit).m_length.m_value = fVar36;
    (this->m_baseline_shit).m_length.m_units = LVar32;
  default:
    goto switchD_001153f9_caseD_3;
  case 5:
    input_00._M_str = (char *)plVar25;
    input_00._M_len = 0x115946;
    parseUrl_abi_cxx11_(input_00);
    this_00 = local_60;
    break;
  case 6:
    FVar9 = parseFillRule(plVar25,input_04);
    this->m_clip_rule = FVar9;
    goto switchD_001153f9_caseD_3;
  case 7:
    input_09._M_str = (char *)this;
    input_09._M_len = (size_t)input_04;
    CVar24 = parseColor(plVar25,input_09,(SVGLayoutState *)&Color::Black,(Color *)in_R8);
    (this->m_color).m_value = CVar24.m_value;
    goto switchD_001153f9_caseD_3;
  case 0xb:
    lVar29 = 0x10;
    goto LAB_00115a30;
  case 0xc:
    lVar29 = 0x10;
    goto LAB_00115764;
  case 0xd:
    lVar29 = 0x10;
    goto LAB_001157b7;
  case 0x10:
    in_R8 = (lunasvg *)&Color::Black;
    input_17._M_str = (char *)this;
    input_17._M_len = (size_t)input_04;
    parsePaint(&local_f8,plVar25,input_17,(SVGLayoutState *)&Color::Black,in_R9);
    std::__cxx11::string::operator=(local_48,(string *)&local_f8);
    (this->m_fill).m_color.m_value = local_f8.m_color.m_value;
    goto LAB_00115b35;
  case 0x11:
    input_10._M_str = (char *)0x1;
    input_10._M_len = (size_t)input_04;
    fVar36 = parseNumberOrPercentage(plVar25,input_10,true,1.0);
    this->m_fill_opacity = fVar36;
    goto switchD_001153f9_caseD_3;
  case 0x12:
    FVar9 = parseFillRule(plVar25,input_04);
    this->m_fill_rule = FVar9;
    goto switchD_001153f9_caseD_3;
  case 0x13:
    std::__cxx11::string::_M_replace
              ((ulong)local_80,0,(char *)(this->m_font_family)._M_string_length,(ulong)input_04);
    in_R8 = plVar25;
    goto switchD_001153f9_caseD_3;
  case 0x14:
    local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
    local_f8.m_id._M_dataplus._M_p._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_ & 0xffffff00;
    input_06._M_str = (char *)input_04;
    input_06._M_len = (size_t)plVar25;
    bVar8 = Length::parse((Length *)&local_f8,input_06,Forbid);
    if (!bVar8) {
      local_f8.m_id._M_dataplus._M_p._0_4_ = 12.0;
      local_f8.m_id._M_dataplus._M_p._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_ & 0xffffff00;
    }
    if ((char)local_f8.m_id._M_dataplus._M_p._4_4_ == '\x04') {
      fVar36 = local_f8.m_id._M_dataplus._M_p._0_4_ * this->m_font_size * 0.5;
    }
    else if ((local_f8.m_id._M_dataplus._M_p._4_4_ & 0xff) == 3) {
      fVar36 = local_f8.m_id._M_dataplus._M_p._0_4_ * this->m_font_size;
    }
    else {
      fVar36 = local_f8.m_id._M_dataplus._M_p._0_4_;
      if ((local_f8.m_id._M_dataplus._M_p._4_4_ & 0xff) == 1) {
        fVar36 = (local_f8.m_id._M_dataplus._M_p._0_4_ * this->m_font_size) / 100.0;
      }
    }
    this->m_font_size = fVar36;
    goto switchD_001153f9_caseD_3;
  case 0x15:
    lVar29 = 0x10;
    goto LAB_00115b5e;
  case 0x16:
    lVar29 = 0x10;
    goto LAB_001158e4;
  case 0x22:
    input_01._M_str = (char *)plVar25;
    input_01._M_len = 0x115969;
    parseUrl_abi_cxx11_(input_01);
    this_00 = local_78;
    break;
  case 0x23:
    input_03._M_str = (char *)plVar25;
    input_03._M_len = 0x115b20;
    parseUrl_abi_cxx11_(input_03);
    this_00 = local_70;
    break;
  case 0x24:
    input_02._M_str = (char *)plVar25;
    input_02._M_len = 0x115a8f;
    parseUrl_abi_cxx11_(input_02);
    this_00 = local_68;
    break;
  case 0x25:
    input._M_str = (char *)plVar25;
    input._M_len = 0x115462;
    parseUrl_abi_cxx11_(input);
    this_00 = local_58;
    break;
  case 0x28:
    lVar29 = 0x10;
    goto LAB_0011568e;
  case 0x2a:
    input_12._M_str = (char *)0x1;
    input_12._M_len = (size_t)input_04;
    fVar36 = parseNumberOrPercentage(plVar25,input_12,true,1.0);
    this->m_opacity = fVar36;
    goto switchD_001153f9_caseD_3;
  case 0x2c:
    lVar29 = 0x10;
    goto LAB_00115479;
  case 0x39:
    input_07._M_str = (char *)this;
    input_07._M_len = (size_t)input_04;
    CVar24 = parseColor(plVar25,input_07,(SVGLayoutState *)&Color::Black,(Color *)in_R8);
    (this->m_stop_color).m_value = CVar24.m_value;
    goto switchD_001153f9_caseD_3;
  case 0x3a:
    input_05._M_str = (char *)0x1;
    input_05._M_len = (size_t)input_04;
    fVar36 = parseNumberOrPercentage(plVar25,input_05,true,1.0);
    this->m_stop_opacity = fVar36;
    goto switchD_001153f9_caseD_3;
  case 0x3b:
    in_R8 = (lunasvg *)&Color::Transparent;
    input_16._M_str = (char *)this;
    input_16._M_len = (size_t)input_04;
    parsePaint(&local_f8,plVar25,input_16,(SVGLayoutState *)&Color::Transparent,in_R9);
    std::__cxx11::string::operator=(local_50,(string *)&local_f8);
    (this->m_stroke).m_color.m_value = local_f8.m_color.m_value;
    goto LAB_00115b35;
  case 0x3c:
    plVar31 = (lunasvg *)0x4;
    if (plVar25 < (lunasvg *)0x4) {
      plVar31 = plVar25;
    }
    local_d0._M_len = (size_t)plVar25;
    local_d0._M_str = (char *)input_04;
    iVar23 = bcmp(input_04,"none",(size_t)plVar31);
    if (((_Fwd_list_node_base *)((long)&p_Var3[-1]._M_next + 4) != p_Var35) || (iVar23 != 0)) {
      local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
      local_f8.m_id._M_dataplus._M_p._4_4_ = 0;
      local_f8.m_id._M_string_length = 0;
      local_f8.m_id.field_2._M_allocated_capacity = 0;
      goto LAB_00115cd1;
    }
    auVar37 = ZEXT816(0);
    uVar26 = (pointer)0x0;
    goto LAB_00115e7d;
  case 0x3d:
    local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
    local_f8.m_id._M_dataplus._M_p._4_4_ = (uint)local_f8.m_id._M_dataplus._M_p._5_3_ << 8;
    input_13._M_str = (char *)input_04;
    input_13._M_len = (size_t)plVar25;
    bVar8 = Length::parse((Length *)&local_f8,input_13,Allow);
    if (!bVar8) {
      local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
      local_f8.m_id._M_dataplus._M_p._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_ & 0xffffff00;
    }
    (this->m_stroke_dashoffset).m_value = local_f8.m_id._M_dataplus._M_p._0_4_;
    (this->m_stroke_dashoffset).m_units = (LengthUnits)local_f8.m_id._M_dataplus._M_p._4_4_;
    goto switchD_001153f9_caseD_3;
  case 0x3e:
    lVar29 = 0x10;
    goto LAB_00115bd5;
  case 0x3f:
    lVar29 = 0x10;
    goto LAB_0011558c;
  case 0x40:
    local_f8.m_id._M_dataplus._M_p._0_4_ = SUB84(plVar25,0);
    local_f8.m_id._M_dataplus._M_p._4_4_ = (uint)((ulong)plVar25 >> 0x20);
    local_f8.m_id._M_string_length = (size_type)input_04;
    bVar8 = parseNumber<float>((string_view *)&local_f8,(float *)&local_d0);
    fVar36 = 4.0;
    if (CONCAT44(local_f8.m_id._M_dataplus._M_p._4_4_,local_f8.m_id._M_dataplus._M_p._0_4_) == 0) {
      fVar36 = (float)local_d0._M_len;
    }
    if (!bVar8) {
      fVar36 = 4.0;
    }
    this->m_stroke_miterlimit = fVar36;
    goto switchD_001153f9_caseD_3;
  case 0x41:
    input_11._M_str = (char *)0x1;
    input_11._M_len = (size_t)input_04;
    fVar36 = parseNumberOrPercentage(plVar25,input_11,true,1.0);
    this->m_stroke_opacity = fVar36;
    goto switchD_001153f9_caseD_3;
  case 0x42:
    local_f8.m_id._M_dataplus._M_p._0_4_ = 0.0;
    local_f8.m_id._M_dataplus._M_p._4_4_ = (uint)local_f8.m_id._M_dataplus._M_p._5_3_ << 8;
    input_08._M_str = (char *)input_04;
    input_08._M_len = (size_t)plVar25;
    bVar8 = Length::parse((Length *)&local_f8,input_08,Forbid);
    if (!bVar8) {
      local_f8.m_id._M_dataplus._M_p._0_4_ = 1.0;
      local_f8.m_id._M_dataplus._M_p._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_ & 0xffffff00;
    }
    (this->m_stroke_width).m_value = local_f8.m_id._M_dataplus._M_p._0_4_;
    (this->m_stroke_width).m_units = (LengthUnits)local_f8.m_id._M_dataplus._M_p._4_4_;
    goto switchD_001153f9_caseD_3;
  case 0x45:
    lVar29 = 0x10;
    goto LAB_00115c72;
  case 0x48:
    lVar29 = 0x10;
    goto LAB_00115539;
  case 0x49:
    lVar29 = 0x10;
    goto LAB_00115aa6;
  }
  std::__cxx11::string::operator=(this_00,(string *)&local_f8);
LAB_00115b35:
  pLVar34 = (pointer)CONCAT44(local_f8.m_id._M_dataplus._M_p._4_4_,
                              local_f8.m_id._M_dataplus._M_p._0_4_);
  if (pLVar34 != (pointer)&local_f8.m_id.field_2) {
    puVar33 = (undefined1 *)(local_f8.m_id.field_2._M_allocated_capacity + 1);
    goto LAB_00115b4f;
  }
  goto switchD_001153f9_caseD_3;
code_r0x001153a0:
  p_Var35 = (_Fwd_list_node_base *)((long)&p_Var35->_M_next + 1);
  if (p_Var3 == p_Var35) goto switchD_001153f9_caseD_3;
  goto LAB_0011538f;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0xb8) {
LAB_00115aa6:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159e58 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseWhiteSpace(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      WVar19 = (&UNK_00159e50)[lVar29];
      goto LAB_00115e22;
    }
  }
  WVar19 = Default;
LAB_00115e22:
  this->m_white_space = WVar19;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x58) {
LAB_00115539:
    if (((_Fwd_list_node_base *)
         ((long)p_Var3 - *(long *)((long)&PTR_anon_var_dwarf_69404_00159f38 + lVar29)) == p_Var35)
       && (iVar23 = bcmp(input_04,*(void **)(&parseVisibility(std::basic_string_view<char,std::char_traits<char>>const&)
                                              ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      VVar11 = *(Visibility *)((long)&DAT_00159f30 + lVar29);
      goto LAB_00115da2;
    }
  }
  VVar11 = Visible;
LAB_00115da2:
  this->m_visibility = VVar11;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x58) {
LAB_00115c72:
    if (((_Fwd_list_node_base *)
         ((long)p_Var3 - *(long *)((long)&PTR_anon_var_dwarf_7156f_00159e08 + lVar29)) == p_Var35)
       && (iVar23 = bcmp(input_04,*(void **)(&parseTextAnchor(std::basic_string_view<char,std::char_traits<char>>const&)
                                              ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      TVar22 = *(TextAnchor *)((long)&DAT_00159e00 + lVar29);
      goto LAB_00115e52;
    }
  }
  TVar22 = Start;
LAB_00115e52:
  this->m_text_anchor = TVar22;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x58) {
LAB_0011558c:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159988 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseLineJoin(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      LVar12 = (&UNK_00159980)[lVar29];
      goto LAB_00115db2;
    }
  }
  LVar12 = Miter;
LAB_00115db2:
  this->m_stroke_linejoin = LVar12;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x58) {
LAB_00115bd5:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159938 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseLineCap(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      LVar21 = *(LineCap *)((long)&PTR_typeinfo_00159930 + lVar29);
      goto LAB_00115e42;
    }
  }
  LVar21 = Butt;
LAB_00115e42:
  this->m_stroke_linecap = LVar21;
  goto switchD_001153f9_caseD_3;
  while( true ) {
    local_d0._M_str = (char *)(plVar31 + (long)(size_t *)local_d0._M_str);
    local_d0._M_len = local_d0._M_len + -(long)plVar31;
    std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::emplace_back<lunasvg::Length>
              ((vector<lunasvg::Length,_std::allocator<lunasvg::Length>_> *)&local_f8,&local_38);
    bVar8 = skipOptionalSpacesOrDelimiter(&local_d0,',');
    if (!bVar8) break;
LAB_00115cd1:
    plVar25 = (lunasvg *)0x0;
    plVar31 = plVar25;
    if ((lunasvg *)local_d0._M_len != (lunasvg *)0x0) {
      do {
        if (((ulong)(byte)plVar25[(long)(size_t *)local_d0._M_str] < 0x2d) &&
           (plVar31 = plVar25,
           (0x100100002600U >> ((ulong)(byte)plVar25[(long)(size_t *)local_d0._M_str] & 0x3f) & 1)
           != 0)) break;
        plVar25 = plVar25 + 1;
        plVar31 = (lunasvg *)local_d0._M_len;
      } while ((lunasvg *)local_d0._M_len != plVar25);
    }
    local_38.m_value = 0.0;
    local_38.m_units = None;
    plVar25 = (lunasvg *)local_d0._M_len;
    if (plVar31 <= local_d0._M_len) {
      plVar25 = plVar31;
    }
    input_14._M_str = local_d0._M_str;
    input_14._M_len = (size_t)plVar25;
    bVar8 = Length::parse(&local_38,input_14,Forbid);
    if (!bVar8) {
      pvVar6 = (void *)CONCAT44(local_f8.m_id._M_dataplus._M_p._4_4_,
                                local_f8.m_id._M_dataplus._M_p._0_4_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_f8.m_id.field_2._M_allocated_capacity - (long)pvVar6);
      }
      auVar37._0_12_ = ZEXT812(0);
      auVar37._12_4_ = 0;
      uVar26 = (pointer)0x0;
      goto LAB_00115e7d;
    }
  }
  auVar37._4_4_ = local_f8.m_id._M_dataplus._M_p._4_4_;
  auVar37._0_4_ = local_f8.m_id._M_dataplus._M_p._0_4_;
  auVar37._8_8_ = local_f8.m_id._M_string_length;
  uVar26 = local_f8.m_id.field_2._M_allocated_capacity;
LAB_00115e7d:
  pLVar34 = (this->m_stroke_dasharray).
            super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar5 = (this->m_stroke_dasharray).
           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_stroke_dasharray).super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar37._0_8_;
  (this->m_stroke_dasharray).super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)auVar37._8_8_;
  (this->m_stroke_dasharray).super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar26;
  if (pLVar34 != (pointer)0x0) {
    puVar33 = (undefined1 *)((long)pLVar5 - (long)pLVar34);
LAB_00115b4f:
    operator_delete(pLVar34,(ulong)puVar33);
  }
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x40) {
LAB_00115479:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159f88 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseOverflow(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      OVar10 = (&UNK_00159f80)[lVar29];
      goto LAB_00115d92;
    }
  }
  OVar10 = Visible;
LAB_00115d92:
  this->m_overflow = OVar10;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x40) {
LAB_0011568e:
    if (((_Fwd_list_node_base *)
         ((long)p_Var3 - *(long *)((long)&PTR_anon_var_dwarf_716f2_00159fb8 + lVar29)) == p_Var35)
       && (iVar23 = bcmp(input_04,*(void **)(&parseMaskType(std::basic_string_view<char,std::char_traits<char>>const&)
                                              ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      MVar13 = *(MaskType *)((long)&DAT_00159fb0 + lVar29);
      goto LAB_00115dc2;
    }
  }
  MVar13 = Luminance;
LAB_00115dc2:
  this->m_mask_type = MVar13;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x148) {
LAB_001158e4:
    if (((_Fwd_list_node_base *)
         ((long)p_Var3 - *(long *)((long)&parseFillRule::entries[1].second._M_str + lVar29)) ==
         p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseFontWeight(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      FVar17 = *(FontWeight *)((long)&parseFillRule::entries[1].second._M_len + lVar29);
      goto LAB_00115e02;
    }
  }
  FVar17 = Normal;
LAB_00115e02:
  this->m_font_weight = FVar17;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x58) {
LAB_00115b5e:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159b48 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseFontStyle(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      FVar20 = (&UNK_00159b40)[lVar29];
      goto LAB_00115e32;
    }
  }
  FVar20 = Normal;
LAB_00115e32:
  this->m_font_style = FVar20;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x130) {
LAB_001157b7:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159cb8 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseDominantBaseline(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      DVar15 = (&UNK_00159cb0)[lVar29];
      goto LAB_00115de2;
    }
  }
  DVar15 = Auto;
LAB_00115de2:
  this->m_dominant_baseline = DVar15;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x40) {
LAB_00115764:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159f08 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseDisplay(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      DVar14 = (&UNK_00159f00)[lVar29];
      goto LAB_00115dd2;
    }
  }
  DVar14 = Inline;
LAB_00115dd2:
  this->m_display = DVar14;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x40) {
LAB_00115a30:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159dd8 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseDirection(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      DVar18 = (&UNK_00159dd0)[lVar29];
      goto LAB_00115e12;
    }
  }
  DVar18 = Ltr;
LAB_00115e12:
  this->m_direction = DVar18;
  goto switchD_001153f9_caseD_3;
  while (lVar29 = lVar29 + 0x18, lVar29 != 0x130) {
LAB_00115400:
    if (((_Fwd_list_node_base *)((long)p_Var3 - *(long *)(&UNK_00159b98 + lVar29)) == p_Var35) &&
       (iVar23 = bcmp(input_04,*(void **)(&parseAlignmentBaseline(std::basic_string_view<char,std::char_traits<char>>const&)
                                           ::entries + lVar29),(size_t)plVar25), iVar23 == 0)) {
      AVar16 = (&UNK_00159b90)[lVar29];
      goto LAB_00115df2;
    }
  }
  AVar16 = Auto;
LAB_00115df2:
  this->m_alignment_baseline = AVar16;
switchD_001153f9_caseD_3:
  p_Var2 = p_Var2->_M_next;
  goto joined_r0x0011533d;
}

Assistant:

SVGLayoutState::SVGLayoutState(const SVGLayoutState& parent, const SVGElement* element)
    : m_parent(&parent)
    , m_element(element)
    , m_fill(parent.fill())
    , m_stroke(parent.stroke())
    , m_color(parent.color())
    , m_fill_opacity(parent.fill_opacity())
    , m_stroke_opacity(parent.stroke_opacity())
    , m_stroke_miterlimit(parent.stroke_miterlimit())
    , m_font_size(parent.font_size())
    , m_stroke_width(parent.stroke_width())
    , m_stroke_dashoffset(parent.stroke_dashoffset())
    , m_stroke_dasharray(parent.stroke_dasharray())
    , m_stroke_linecap(parent.stroke_linecap())
    , m_stroke_linejoin(parent.stroke_linejoin())
    , m_fill_rule(parent.fill_rule())
    , m_clip_rule(parent.clip_rule())
    , m_font_weight(parent.font_weight())
    , m_font_style(parent.font_style())
    , m_dominant_baseline(parent.dominant_baseline())
    , m_text_anchor(parent.text_anchor())
    , m_white_space(parent.white_space())
    , m_direction(parent.direction())
    , m_visibility(parent.visibility())
    , m_overflow(element->isRootElement() ? Overflow::Visible : Overflow::Hidden)
    , m_marker_start(parent.marker_start())
    , m_marker_mid(parent.marker_mid())
    , m_marker_end(parent.marker_end())
    , m_font_family(parent.font_family())
{
    for(const auto& attribute : element->attributes()) {
        std::string_view input(attribute.value());
        stripLeadingAndTrailingSpaces(input);
        if(input.empty() || input.compare("inherit") == 0)
            continue;
        switch(attribute.id()) {
        case PropertyID::Fill:
            m_fill = parsePaint(input, this, Color::Black);
            break;
        case PropertyID::Stroke:
            m_stroke = parsePaint(input, this, Color::Transparent);
            break;
        case PropertyID::Color:
            m_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Stop_Color:
            m_stop_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Opacity:
            m_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Fill_Opacity:
            m_fill_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Opacity:
            m_stroke_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stop_Opacity:
            m_stop_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Miterlimit:
            m_stroke_miterlimit = parseNumberOrPercentage(input, false, 4.f);
            break;
        case PropertyID::Font_Size:
            m_font_size = parseFontSize(input, this);
            break;
        case PropertyID::Baseline_Shift:
            m_baseline_shit = parseBaselineShift(input);
            break;
        case PropertyID::Stroke_Width:
            m_stroke_width = parseLength(input, LengthNegativeMode::Forbid, Length(1.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dashoffset:
            m_stroke_dashoffset = parseLength(input, LengthNegativeMode::Allow, Length(0.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dasharray:
            m_stroke_dasharray = parseDashArray(input);
            break;
        case PropertyID::Stroke_Linecap:
            m_stroke_linecap = parseLineCap(input);
            break;
        case PropertyID::Stroke_Linejoin:
            m_stroke_linejoin = parseLineJoin(input);
            break;
        case PropertyID::Fill_Rule:
            m_fill_rule = parseFillRule(input);
            break;
        case PropertyID::Clip_Rule:
            m_clip_rule = parseFillRule(input);
            break;
        case PropertyID::Font_Weight:
            m_font_weight = parseFontWeight(input);
            break;
        case PropertyID::Font_Style:
            m_font_style = parseFontStyle(input);
            break;
        case PropertyID::Alignment_Baseline:
            m_alignment_baseline = parseAlignmentBaseline(input);
            break;
        case PropertyID::Dominant_Baseline:
            m_dominant_baseline = parseDominantBaseline(input);
            break;
        case PropertyID::Direction:
            m_direction = parseDirection(input);
            break;
        case PropertyID::Text_Anchor:
            m_text_anchor = parseTextAnchor(input);
            break;
        case PropertyID::WhiteSpace:
            m_white_space = parseWhiteSpace(input);
            break;
        case PropertyID::Display:
            m_display = parseDisplay(input);
            break;
        case PropertyID::Visibility:
            m_visibility = parseVisibility(input);
            break;
        case PropertyID::Overflow:
            m_overflow = parseOverflow(input);
            break;
        case PropertyID::Mask_Type:
            m_mask_type = parseMaskType(input);
            break;
        case PropertyID::Mask:
            m_mask = parseUrl(input);
            break;
        case PropertyID::Clip_Path:
            m_clip_path = parseUrl(input);
            break;
        case PropertyID::Marker_Start:
            m_marker_start = parseUrl(input);
            break;
        case PropertyID::Marker_Mid:
            m_marker_mid = parseUrl(input);
            break;
        case PropertyID::Marker_End:
            m_marker_end = parseUrl(input);
            break;
        case PropertyID::Font_Family:
            m_font_family.assign(input);
            break;
        default:
            break;
        }
    }
}